

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_value_numbering.cpp
# Opt level: O1

void __thiscall
mocker::GlobalValueNumbering::doValueNumbering
          (GlobalValueNumbering *this,_List_node_base *bbLabel,
          _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *valueNumber,
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *param_4)

{
  _List_node_base *p_Var1;
  Reg *pRVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *ppVar4;
  _Hash_node_base *p_Var5;
  _Alloc_hider _Var6;
  size_type sVar7;
  size_type sVar8;
  undefined8 uVar9;
  pointer psVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  element_type *peVar15;
  bool bVar16;
  int iVar17;
  _List_node_base *p_Var18;
  const_iterator cVar19;
  iterator iVar20;
  long lVar21;
  mapped_type *pmVar22;
  element_type *peVar23;
  BasicBlock *pBVar24;
  mapped_type *pmVar25;
  _Prime_rehash_policy *p_Var26;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *__args;
  Reg *pRVar27;
  undefined7 uVar28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var29;
  _List_node_base *p_Var30;
  _Hash_node_base *p_Var31;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *option;
  Reg *pRVar32;
  long lVar33;
  bool bVar34;
  bool bVar35;
  Key key;
  shared_ptr<mocker::ir::IntLiteral> lhsLit;
  shared_ptr<mocker::ir::Reg> rhsReg;
  shared_ptr<mocker::ir::Addr> val;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_178;
  Key local_168;
  undefined1 local_140 [24];
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  local_128;
  element_type *local_110;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_108;
  GlobalValueNumbering *local_f0;
  Reg local_e8;
  _List_node_base *local_c0;
  shared_ptr<mocker::ir::Addr> local_b8;
  BasicBlock *local_a8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a0;
  _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_140._16_8_ = param_4;
  local_f0 = this;
  local_c0 = bbLabel;
  local_a8 = ir::FunctionModule::getMutableBasicBlock((this->super_FuncPass).func,(size_t)bbLabel);
  p_Var30 = (_List_node_base *)&local_a8->insts;
  local_e8.identifier.field_2._8_8_ = p_Var30;
  do {
    p_Var30 = (((_List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                 *)&p_Var30->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    lVar33 = (long)p_Var30[1]._M_next;
    if (*(int *)(lVar33 + 8) == 0) {
      p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var30[1]._M_prev;
      if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
        }
      }
    }
    else {
      p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      lVar33 = 0;
    }
    if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var29);
    }
    iVar17 = 4;
    if (lVar33 == 0) {
      lVar33 = (long)p_Var30[1]._M_next;
      if (*(int *)(lVar33 + 8) == 0xf) {
        p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var30[1]._M_prev;
        if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
          }
        }
      }
      else {
        p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        lVar33 = 0;
      }
      if (lVar33 == 0) {
        iVar17 = 2;
      }
      else {
        p_Var18 = *(_List_node_base **)(lVar33 + 0x28);
        p_Var1 = *(_List_node_base **)(lVar33 + 0x30);
        while ((bVar34 = p_Var18 != p_Var1, bVar34 &&
               (bbLabel = p_Var18,
               bVar16 = detail::ValueNumberTable::has
                                  ((ValueNumberTable *)valueNumber,
                                   (shared_ptr<mocker::ir::Addr> *)p_Var18), bVar16))) {
          p_Var18 = p_Var18 + 2;
        }
        if (bVar34) {
          local_168._M_dataplus._M_p = *(pointer *)(lVar33 + 0x18);
          local_168._M_string_length = *(long *)(lVar33 + 0x20);
          if ((element_type *)local_168._M_string_length != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(((element_type *)local_168._M_string_length)->identifier)._M_dataplus._M_p =
                   *(int *)&(((element_type *)local_168._M_string_length)->identifier)._M_dataplus.
                            _M_p + 1;
              UNLOCK();
            }
            else {
              *(int *)&(((element_type *)local_168._M_string_length)->identifier)._M_dataplus._M_p =
                   *(int *)&(((element_type *)local_168._M_string_length)->identifier)._M_dataplus.
                            _M_p + 1;
            }
          }
          bbLabel = (_List_node_base *)(lVar33 + 0x18);
          detail::ValueNumberTable::set
                    ((ValueNumberTable *)valueNumber,(shared_ptr<mocker::ir::Reg> *)bbLabel,
                     (shared_ptr<mocker::ir::Addr> *)&local_168);
          if ((element_type *)local_168._M_string_length != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._M_string_length);
          }
          iVar17 = 4;
        }
        else {
          local_e8.super_Addr._vptr_Addr = (_func_int **)**(long **)(lVar33 + 0x28);
          local_e8.identifier._M_dataplus._M_p = (pointer)(*(long **)(lVar33 + 0x28))[1];
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.identifier._M_dataplus._M_p
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.identifier._M_dataplus._M_p)
              ->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_e8.identifier._M_dataplus._M_p)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.identifier._M_dataplus._M_p)
              ->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_e8.identifier._M_dataplus._M_p)->_M_use_count + 1;
            }
          }
          pRVar2 = *(Reg **)(lVar33 + 0x30);
          for (pRVar32 = *(Reg **)(lVar33 + 0x28); pRVar32 != pRVar2;
              pRVar32 = (Reg *)((pRVar32->identifier).field_2._M_local_buf + 8)) {
            ir::detail::dyc_impl<mocker::ir::Reg,std::shared_ptr<mocker::ir::Addr>const&>
                      ((shared_ptr<mocker::ir::Addr> *)&local_168,&local_e8);
            ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>
                      ((shared_ptr<mocker::ir::Addr> *)&local_128,(IntLiteral *)&local_e8);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_128.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 &&
                (element_type *)local_168._M_dataplus._M_p == (element_type *)0x0) {
              __assert_fail("lhsReg || lhsLit",
                            "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/global_value_numbering.cpp"
                            ,0x86,
                            "bool mocker::(anonymous namespace)::areSameAddrs(const std::shared_ptr<ir::Addr> &, const std::shared_ptr<ir::Addr> &)"
                           );
            }
            ir::detail::dyc_impl<mocker::ir::Reg,std::shared_ptr<mocker::ir::Addr>const&>
                      ((shared_ptr<mocker::ir::Addr> *)&local_108,pRVar32);
            pRVar27 = pRVar32;
            ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>
                      ((shared_ptr<mocker::ir::Addr> *)local_140,(IntLiteral *)pRVar32);
            if ((element_type *)
                local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start == (element_type *)0x0 &&
                (element_type *)local_140._0_8_ == (element_type *)0x0) {
              __assert_fail("rhsReg || rhsLit",
                            "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/global_value_numbering.cpp"
                            ,0x89,
                            "bool mocker::(anonymous namespace)::areSameAddrs(const std::shared_ptr<ir::Addr> &, const std::shared_ptr<ir::Addr> &)"
                           );
            }
            uVar28 = (undefined7)((ulong)pRVar27 >> 8);
            bbLabel = (_List_node_base *)
                      CONCAT71(uVar28,(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                      local_128.
                                      super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start ==
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
            if ((element_type *)local_140._0_8_ == (element_type *)0x0 ||
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_128.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              bVar34 = (element_type *)local_168._M_dataplus._M_p == (element_type *)0x0 ||
                       (element_type *)
                       local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start == (element_type *)0x0;
              bbLabel = (_List_node_base *)CONCAT71(uVar28,bVar34);
              if ((bVar34) ||
                 (p_Var18 = ((_List_node_base *)(local_168._M_dataplus._M_p + 0x10))->_M_next,
                 p_Var18 !=
                 (_List_node_base *)
                 ((string *)
                 ((long)local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + 8))->_M_string_length)) {
                bVar34 = false;
              }
              else if (p_Var18 == (_List_node_base *)0x0) {
                bVar34 = true;
              }
              else {
                bbLabel = (_List_node_base *)
                          (((string *)
                           ((long)local_108.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 8))->_M_dataplus)._M_p;
                iVar17 = bcmp((_List_node_base *)
                              (((string *)(local_168._M_dataplus._M_p + 8))->_M_dataplus)._M_p,
                              bbLabel,(size_t)p_Var18);
                bVar34 = iVar17 == 0;
              }
            }
            else {
              bVar34 = *(_List_node_base **)
                        ((long)local_128.
                               super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 8) ==
                       (_List_node_base *)(((string *)(local_140._0_8_ + 8))->_M_dataplus)._M_p;
            }
            if ((element_type *)local_140._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_);
            }
            if ((element_type *)
                local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_128.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_128.
                         super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
            if ((element_type *)local_168._M_string_length != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._M_string_length)
              ;
            }
            if (!bVar34) {
              local_b8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_b8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              goto LAB_00166fa9;
            }
          }
          local_b8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_e8.super_Addr._vptr_Addr;
          local_b8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_e8.identifier._M_dataplus._M_p;
          local_e8.super_Addr._vptr_Addr = (_func_int **)0x0;
          local_e8.identifier._M_dataplus._M_p = (pointer)0x0;
LAB_00166fa9:
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.identifier._M_dataplus._M_p
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_e8.identifier._M_dataplus._M_p);
          }
          peVar15 = local_b8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          if (local_b8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            iVar17 = 0;
          }
          else {
            bbLabel = (_List_node_base *)(lVar33 + 0x18);
            detail::ValueNumberTable::set
                      ((ValueNumberTable *)valueNumber,(shared_ptr<mocker::ir::Reg> *)bbLabel,
                       &local_b8);
            p_Var18 = (_List_node_base *)operator_new(0x20);
            p_Var18->_M_prev = (_List_node_base *)0x100000001;
            p_Var18->_M_next = (_List_node_base *)&PTR___Sp_counted_ptr_inplace_001efd18;
            *(undefined4 *)&p_Var18[1]._M_prev = 0;
            p_Var18[1]._M_next = (_List_node_base *)&PTR__IRInst_001efd68;
            p_Var30[1]._M_next = p_Var18 + 1;
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var30[1]._M_prev;
            p_Var30[1]._M_prev = p_Var18;
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
            }
            local_f0->cnt = local_f0->cnt + 1;
            iVar17 = 4;
          }
          if (local_b8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_b8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (peVar15 == (element_type *)0x0) {
            detail::InstHash::operator()[abi_cxx11_
                      (&local_168,(InstHash *)bbLabel,
                       (shared_ptr<mocker::ir::IRInst> *)(p_Var30 + 1));
            cVar19 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_140._16_8_,&local_168);
            p_Var18 = (_List_node_base *)(lVar33 + 0x18);
            if (cVar19.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              local_128.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(lVar33 + 0x18);
              local_128.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(lVar33 + 0x20);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_128.
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_128.
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_128.
                       super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_128.
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_128.
                       super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                }
              }
              detail::ValueNumberTable::set
                        ((ValueNumberTable *)valueNumber,(shared_ptr<mocker::ir::Reg> *)p_Var18,
                         (shared_ptr<mocker::ir::Addr> *)&local_128);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_128.
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_128.
                           super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
              }
              pmVar22 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_140._16_8_,&local_168);
              bbLabel = (_List_node_base *)(lVar33 + 0x20);
              (pmVar22->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
                   ((__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)&p_Var18->_M_next)
                   ->_M_ptr;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&(pmVar22->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)
                          ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)bbLabel);
              iVar17 = 0;
            }
            else {
              iVar20 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)local_140._16_8_,&local_168);
              if (iVar20.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
                  ._M_cur == (__node_type *)0x0) {
                std::__throw_out_of_range("_Map_base::at");
              }
              local_128.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   *(pointer *)
                    ((long)iVar20.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
                           ._M_cur + 0x28);
              local_128.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   *(pointer *)
                    ((long)iVar20.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
                           ._M_cur + 0x30);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_128.
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_128.
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_128.
                       super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_128.
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_128.
                       super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                }
              }
              detail::ValueNumberTable::set
                        ((ValueNumberTable *)valueNumber,(shared_ptr<mocker::ir::Reg> *)p_Var18,
                         (shared_ptr<mocker::ir::Addr> *)&local_128);
              bbLabel = p_Var18;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_128.
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_128.
                           super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
                bbLabel = p_Var18;
              }
              p_Var18 = (_List_node_base *)operator_new(0x20);
              p_Var18->_M_prev = (_List_node_base *)0x100000001;
              p_Var18->_M_next = (_List_node_base *)&PTR___Sp_counted_ptr_inplace_001efd18;
              *(undefined4 *)&p_Var18[1]._M_prev = 0;
              p_Var18[1]._M_next = (_List_node_base *)&PTR__IRInst_001efd68;
              p_Var30[1]._M_next = p_Var18 + 1;
              p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var30[1]._M_prev;
              p_Var30[1]._M_prev = p_Var18;
              if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
              }
              local_f0->cnt = local_f0->cnt + 1;
              iVar17 = 4;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              bbLabel = (_List_node_base *)(local_168.field_2._M_allocated_capacity + 1);
              operator_delete(local_168._M_dataplus._M_p,(ulong)bbLabel);
            }
          }
        }
      }
      if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var29);
      }
    }
  } while (iVar17 != 2);
  if (p_Var30 != (_List_node_base *)local_e8.identifier.field_2._8_8_) {
    do {
      p_Var18 = p_Var30 + 1;
      ir::getOperandsUsed(&local_128,(shared_ptr<mocker::ir::IRInst> *)p_Var18);
      psVar10 = local_128.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_128.
                     super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar10; p_Var29 = p_Var29 + 1)
      {
        detail::ValueNumberTable::get
                  ((ValueNumberTable *)&local_168,(shared_ptr<mocker::ir::Addr> *)valueNumber);
        sVar7 = local_168._M_string_length;
        _Var6._M_p = local_168._M_dataplus._M_p;
        local_168._M_dataplus._M_p = (pointer)0x0;
        local_168._M_string_length = 0;
        sVar8 = local_168._M_string_length;
        p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var29->_M_use_count;
        p_Var29->_vptr__Sp_counted_base = (_func_int **)_Var6._M_p;
        local_168._M_string_length._0_4_ = (undefined4)sVar7;
        local_168._M_string_length._4_4_ = SUB84(sVar7,4);
        p_Var29->_M_use_count = (undefined4)local_168._M_string_length;
        p_Var29->_M_weak_count = local_168._M_string_length._4_4_;
        local_168._M_string_length = sVar8;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        if ((element_type *)local_168._M_string_length != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._M_string_length);
        }
      }
      ir::copyWithReplacedOperands
                ((ir *)&local_168,(shared_ptr<mocker::ir::IRInst> *)p_Var18,&local_128);
      sVar7 = local_168._M_string_length;
      _Var6._M_p = local_168._M_dataplus._M_p;
      local_168._M_dataplus._M_p = (pointer)0x0;
      local_168._M_string_length = 0;
      p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var30[1]._M_prev;
      p_Var30[1]._M_next = (_List_node_base *)_Var6._M_p;
      p_Var30[1]._M_prev = (_List_node_base *)sVar7;
      if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var29);
      }
      if ((element_type *)local_168._M_string_length != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._M_string_length);
      }
      peVar23 = (element_type *)p_Var18;
      ir::getDest((ir *)&local_108,(shared_ptr<mocker::ir::IRInst> *)p_Var18);
      if ((element_type *)
          local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (element_type *)0x0) {
        lVar33 = (long)p_Var18->_M_next;
        if (*(int *)(lVar33 + 8) == 8) {
          p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var30[1]._M_prev;
          if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
            }
          }
        }
        else {
          lVar33 = 0;
          p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        bVar34 = true;
        if (lVar33 == 0) {
          lVar21 = (long)p_Var18->_M_next;
          if (*(int *)(lVar21 + 8) == 9) {
            peVar23 = (element_type *)p_Var30[1]._M_prev;
            local_110 = peVar23;
            if (peVar23 != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&(peVar23->identifier)._M_dataplus._M_p =
                     *(int *)&(peVar23->identifier)._M_dataplus._M_p + 1;
                UNLOCK();
              }
              else {
                *(int *)&(peVar23->identifier)._M_dataplus._M_p =
                     *(int *)&(peVar23->identifier)._M_dataplus._M_p + 1;
              }
            }
          }
          else {
            lVar21 = 0;
            local_110 = (element_type *)0x0;
          }
          if (lVar21 != 0) goto LAB_001673a7;
          lVar21 = (long)p_Var18->_M_next;
          if (*(int *)(lVar21 + 8) == 10) {
            peVar23 = (element_type *)p_Var30[1]._M_prev;
            local_e8.identifier.field_2._M_allocated_capacity = (size_type)peVar23;
            if (peVar23 != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&(peVar23->identifier)._M_dataplus._M_p =
                     *(int *)&(peVar23->identifier)._M_dataplus._M_p + 1;
                UNLOCK();
              }
              else {
                *(int *)&(peVar23->identifier)._M_dataplus._M_p =
                     *(int *)&(peVar23->identifier)._M_dataplus._M_p + 1;
              }
            }
          }
          else {
            lVar21 = 0;
            local_e8.identifier.field_2._M_allocated_capacity = 0;
          }
          if (lVar21 != 0) {
            bVar16 = false;
            goto LAB_001673aa;
          }
          lVar21 = (long)p_Var18->_M_next;
          if (*(int *)(lVar21 + 8) == 0xe) {
            local_e8.identifier._M_string_length = (size_type)p_Var30[1]._M_prev;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.identifier._M_string_length
                != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_e8.identifier._M_string_length)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_e8.identifier._M_string_length)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_e8.identifier._M_string_length)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_e8.identifier._M_string_length)->_M_use_count + 1;
              }
            }
          }
          else {
            lVar21 = 0;
            local_e8.identifier._M_string_length = 0;
          }
          bVar35 = lVar21 != 0;
          bVar34 = false;
          bVar16 = false;
        }
        else {
LAB_001673a7:
          bVar16 = true;
LAB_001673aa:
          bVar35 = true;
        }
        if ((!bVar34) &&
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.identifier._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_e8.identifier._M_string_length);
        }
        if (!bVar16 &&
            (element_type *)local_e8.identifier.field_2._M_allocated_capacity != (element_type *)0x0
           ) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_e8.identifier.field_2._M_allocated_capacity);
        }
        if (local_110 != (element_type *)0x0 && lVar33 == 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110);
        }
        if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var29);
        }
        if (bVar35) {
          local_168._M_dataplus._M_p =
               (pointer)local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          local_168._M_string_length =
               (size_type)
               local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if ((element_type *)
              local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(((string *)
                        ((long)local_108.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 8))->_M_dataplus)._M_p =
                   *(int *)&(((string *)
                             ((long)local_108.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 8))->_M_dataplus).
                            _M_p + 1;
              UNLOCK();
            }
            else {
              *(int *)&(((string *)
                        ((long)local_108.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 8))->_M_dataplus)._M_p =
                   *(int *)&(((string *)
                             ((long)local_108.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 8))->_M_dataplus).
                            _M_p + 1;
            }
          }
          detail::ValueNumberTable::set
                    ((ValueNumberTable *)valueNumber,(shared_ptr<mocker::ir::Reg> *)&local_108,
                     (shared_ptr<mocker::ir::Addr> *)&local_168);
        }
        else {
          lVar33 = (long)p_Var18->_M_next;
          if (*(int *)(lVar33 + 8) == 6) {
            p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var30[1]._M_prev;
            if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
              }
            }
          }
          else {
            lVar33 = 0;
            p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var29);
          }
          if (lVar33 == 0) {
            detail::InstHash::operator()[abi_cxx11_
                      (&local_168,(InstHash *)peVar23,(shared_ptr<mocker::ir::IRInst> *)p_Var18);
            cVar19 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_140._16_8_,&local_168);
            if (cVar19.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              local_140._0_8_ =
                   local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              local_140._8_8_ =
                   local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if ((element_type *)
                  local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish != (element_type *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)&(((string *)
                            ((long)local_108.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 8))->_M_dataplus).
                           _M_p =
                       *(int *)&(((string *)
                                 ((long)local_108.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + 8))->
                                _M_dataplus)._M_p + 1;
                  UNLOCK();
                }
                else {
                  *(int *)&(((string *)
                            ((long)local_108.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 8))->_M_dataplus).
                           _M_p =
                       *(int *)&(((string *)
                                 ((long)local_108.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + 8))->
                                _M_dataplus)._M_p + 1;
                }
              }
              detail::ValueNumberTable::set
                        ((ValueNumberTable *)valueNumber,(shared_ptr<mocker::ir::Reg> *)&local_108,
                         (shared_ptr<mocker::ir::Addr> *)local_140);
              if ((element_type *)local_140._8_8_ != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_);
              }
              pmVar22 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_140._16_8_,&local_168);
              (pmVar22->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
                   (element_type *)
                   local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&(pmVar22->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)
                          ._M_refcount,
                         (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_108.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish);
            }
            else {
              iVar20 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)local_140._16_8_,&local_168);
              if (iVar20.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
                  ._M_cur == (__node_type *)0x0) {
                std::__throw_out_of_range("_Map_base::at");
              }
              local_140._0_8_ =
                   *(undefined8 *)
                    ((long)iVar20.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
                           ._M_cur + 0x28);
              peVar23 = *(element_type **)
                         ((long)iVar20.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
                                ._M_cur + 0x30);
              if (peVar23 != (element_type *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)&(peVar23->identifier)._M_dataplus._M_p =
                       *(int *)&(peVar23->identifier)._M_dataplus._M_p + 1;
                  UNLOCK();
                }
                else {
                  *(int *)&(peVar23->identifier)._M_dataplus._M_p =
                       *(int *)&(peVar23->identifier)._M_dataplus._M_p + 1;
                }
                if (peVar23 != (element_type *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(int *)&(peVar23->identifier)._M_dataplus._M_p =
                         *(int *)&(peVar23->identifier)._M_dataplus._M_p + 1;
                    UNLOCK();
                  }
                  else {
                    *(int *)&(peVar23->identifier)._M_dataplus._M_p =
                         *(int *)&(peVar23->identifier)._M_dataplus._M_p + 1;
                  }
                }
              }
              local_140._8_8_ = peVar23;
              detail::ValueNumberTable::set
                        ((ValueNumberTable *)valueNumber,(shared_ptr<mocker::ir::Reg> *)&local_108,
                         (shared_ptr<mocker::ir::Addr> *)local_140);
              if ((element_type *)local_140._8_8_ != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_);
              }
              p_Var18 = (_List_node_base *)operator_new(0x20);
              p_Var18->_M_prev = (_List_node_base *)0x100000001;
              p_Var18->_M_next = (_List_node_base *)&PTR___Sp_counted_ptr_inplace_001efd18;
              *(undefined4 *)&p_Var18[1]._M_prev = 0;
              p_Var18[1]._M_next = (_List_node_base *)&PTR__IRInst_001efd68;
              p_Var30[1]._M_next = p_Var18 + 1;
              p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var30[1]._M_prev;
              p_Var30[1]._M_prev = p_Var18;
              if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var29);
              }
              local_f0->cnt = local_f0->cnt + 1;
              if (peVar23 != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar23);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p,
                              (ulong)(local_168.field_2._M_allocated_capacity + 1));
            }
            goto LAB_001675b5;
          }
          local_168._M_dataplus._M_p =
               (pointer)local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          local_168._M_string_length =
               (size_type)
               local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if ((element_type *)
              local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(((string *)
                        ((long)local_108.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 8))->_M_dataplus)._M_p =
                   *(int *)&(((string *)
                             ((long)local_108.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 8))->_M_dataplus).
                            _M_p + 1;
              UNLOCK();
            }
            else {
              *(int *)&(((string *)
                        ((long)local_108.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 8))->_M_dataplus)._M_p =
                   *(int *)&(((string *)
                             ((long)local_108.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 8))->_M_dataplus).
                            _M_p + 1;
            }
          }
          detail::ValueNumberTable::set
                    ((ValueNumberTable *)valueNumber,(shared_ptr<mocker::ir::Reg> *)&local_108,
                     (shared_ptr<mocker::ir::Addr> *)&local_168);
        }
        if ((element_type *)local_168._M_string_length != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._M_string_length);
        }
      }
LAB_001675b5:
      if ((element_type *)
          local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
      ::~vector(&local_128);
      p_Var30 = p_Var30->_M_next;
    } while (p_Var30 != (_List_node_base *)local_e8.identifier.field_2._8_8_);
  }
  ir::BasicBlock::getSuccessors(&local_108,local_a8);
  local_e8.identifier.field_2._8_8_ =
       local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    peVar23 = (element_type *)
              local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_110 = peVar23;
      pBVar24 = ir::FunctionModule::getMutableBasicBlock
                          ((local_f0->super_FuncPass).func,(size_t)(peVar23->super_Addr)._vptr_Addr)
      ;
      for (p_Var30 = (pBVar24->insts).
                     super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                     ._M_impl._M_node.super__List_node_base._M_next;
          p_Var30 != (_List_node_base *)&pBVar24->insts; p_Var30 = p_Var30->_M_next) {
        p_Var18 = p_Var30[1]._M_next;
        if (*(int *)&p_Var18->_M_prev == 0) {
          p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var30[1]._M_prev;
          if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var29->_M_use_count = p_Var29->_M_use_count + 1;
            }
          }
        }
        else {
          p_Var18 = (_List_node_base *)0x0;
          p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var29);
        }
        iVar17 = 0xd;
        if (p_Var18 == (_List_node_base *)0x0) {
          p_Var18 = p_Var30[1]._M_next;
          if (*(int *)&p_Var18->_M_prev == 0xf) {
            local_178 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var30[1]._M_prev;
            if (local_178 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_178->_M_use_count = local_178->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_178->_M_use_count = local_178->_M_use_count + 1;
              }
            }
          }
          else {
            p_Var18 = (_List_node_base *)0x0;
            local_178 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          if (p_Var18 == (_List_node_base *)0x0) {
            iVar17 = 0xc;
          }
          else {
            local_128.
            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_128.
            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_128.
            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ppVar4 = (pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *
                     )p_Var18[3]._M_next;
            for (__args = *(pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>
                            **)((long)(p_Var18 + 2) + 8); __args != ppVar4; __args = __args + 1) {
              if ((_List_node_base *)
                  ((__args->second).
                   super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id ==
                  local_c0) {
                detail::ValueNumberTable::get
                          ((ValueNumberTable *)local_140,(shared_ptr<mocker::ir::Addr> *)valueNumber
                          );
                local_168._M_dataplus._M_p = (pointer)local_140._0_8_;
                local_168._M_string_length = local_140._8_8_;
                local_140._0_8_ = (element_type *)0x0;
                local_140._8_8_ = (element_type *)0x0;
                local_168.field_2._M_allocated_capacity =
                     (size_type)
                     (__args->second).
                     super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_168.field_2._8_8_ =
                     (__args->second).
                     super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.field_2._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.field_2._8_8_)->
                    _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   local_168.field_2._8_8_)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.field_2._8_8_)->
                    _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   local_168.field_2._8_8_)->_M_use_count + 1;
                  }
                }
                std::
                vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                ::
                emplace_back<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>
                          ((vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                            *)&local_128,
                           (pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>
                            *)&local_168);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.field_2._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.field_2._8_8_
                            );
                }
                if ((element_type *)local_168._M_string_length != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_168._M_string_length);
                }
                if ((element_type *)local_140._8_8_ != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_);
                }
              }
              else {
                std::
                vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                ::
                emplace_back<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>const&>
                          ((vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                            *)&local_128,__args);
              }
            }
            local_e8.super_Addr._vptr_Addr = (_func_int **)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::ir::Phi,std::allocator<mocker::ir::Phi>,std::shared_ptr<mocker::ir::Reg>const&,std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8.identifier,
                       (Phi **)&local_e8,(allocator<mocker::ir::Phi> *)&local_168,
                       (shared_ptr<mocker::ir::Reg> *)((long)(p_Var18 + 1) + 8),
                       (vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                        *)&local_128);
            std::
            vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
            ::~vector((vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                       *)&local_128);
            uVar11 = local_e8.super_Addr._vptr_Addr._0_4_;
            uVar12 = local_e8.super_Addr._vptr_Addr._4_4_;
            uVar13 = local_e8.identifier._M_dataplus._M_p._0_4_;
            uVar14 = local_e8.identifier._M_dataplus._M_p._4_4_;
            local_e8.super_Addr._vptr_Addr = (_func_int **)0x0;
            local_e8.identifier._M_dataplus._M_p = (pointer)0x0;
            p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var30[1]._M_prev;
            *(undefined4 *)&p_Var30[1]._M_next = uVar11;
            *(undefined4 *)((long)&p_Var30[1]._M_next + 4) = uVar12;
            *(undefined4 *)&p_Var30[1]._M_prev = uVar13;
            *(undefined4 *)((long)&p_Var30[1]._M_prev + 4) = uVar14;
            if (p_Var29 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var29);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.identifier._M_dataplus._M_p
                != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_e8.identifier._M_dataplus._M_p);
            }
            iVar17 = 0;
          }
          if (local_178 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178);
          }
        }
        if ((iVar17 != 0xd) && (iVar17 != 0)) break;
      }
      peVar23 = (element_type *)&local_110->identifier;
    } while (peVar23 != (element_type *)local_e8.identifier.field_2._8_8_);
  }
  if ((element_type *)
      local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (element_type *)0x0) {
    operator_delete(local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_168._M_dataplus._M_p = (pointer)local_c0;
  pmVar25 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&(local_f0->dominatorTree).dominatorTree,(key_type *)&local_168);
  uVar9 = local_140._16_8_;
  p_Var31 = (pmVar25->_M_h)._M_before_begin._M_nxt;
  if (p_Var31 != (_Hash_node_base *)0x0) {
    local_c0 = (_List_node_base *)&valueNumber->_M_rehash_policy;
    p_Var26 = (_Prime_rehash_policy *)(local_140._16_8_ + 0x20);
    do {
      p_Var5 = p_Var31[1]._M_nxt;
      local_68._M_buckets = (__buckets_ptr)0x0;
      local_68._M_bucket_count = valueNumber->_M_bucket_count;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = valueNumber->_M_element_count;
      local_68._M_rehash_policy._0_8_ = local_c0->_M_next;
      local_68._M_rehash_policy._M_next_resize = (size_t)local_c0->_M_prev;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      local_168._M_dataplus._M_p = (pointer)&local_68;
      std::
      _Hashtable<std::shared_ptr<mocker::ir::Reg>,std::pair<std::shared_ptr<mocker::ir::Reg>const,std::shared_ptr<mocker::ir::Addr>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Reg>const,std::shared_ptr<mocker::ir::Addr>>>,std::__detail::_Select1st,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<std::shared_ptr<mocker::ir::Reg>,std::pair<std::shared_ptr<mocker::ir::Reg>const,std::shared_ptr<mocker::ir::Addr>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Reg>const,std::shared_ptr<mocker::ir::Addr>>>,std::__detail::_Select1st,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::shared_ptr<mocker::ir::Reg>const,std::shared_ptr<mocker::ir::Addr>>,true>>>>
                ((_Hashtable<std::shared_ptr<mocker::ir::Reg>,std::pair<std::shared_ptr<mocker::ir::Reg>const,std::shared_ptr<mocker::ir::Addr>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Reg>const,std::shared_ptr<mocker::ir::Addr>>>,std::__detail::_Select1st,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_68,valueNumber,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>,_true>_>_>
                  *)&local_168);
      local_a0._M_buckets = (__buckets_ptr)0x0;
      local_a0._M_bucket_count = *(size_type *)(local_140._16_8_ + 8);
      local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_a0._M_element_count = *(size_type *)(local_140._16_8_ + 0x18);
      local_a0._M_rehash_policy._M_max_load_factor = p_Var26->_M_max_load_factor;
      local_a0._M_rehash_policy._4_4_ = *(undefined4 *)&p_Var26->field_0x4;
      local_a0._M_rehash_policy._M_next_resize = *(size_t *)(uVar9 + 0x28);
      local_a0._M_single_bucket = (__node_base_ptr)0x0;
      local_168._M_dataplus._M_p = (pointer)&local_a0;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ir::Reg>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ir::Reg>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ir::Reg>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ir::Reg>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ir::Reg>>,true>>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ir::Reg>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ir::Reg>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_a0,
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_140._16_8_,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>_>_>
                  *)&local_168);
      doValueNumbering(local_f0,p_Var5,&local_68,&local_a0);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_a0);
      std::
      _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_68);
      p_Var31 = p_Var31->_M_nxt;
    } while (p_Var31 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void GlobalValueNumbering::doValueNumbering(
    std::size_t bbLabel, detail::ValueNumberTable valueNumber,
    detail::InstHash instHash, ExprRegMap exprReg) {
  auto &bb = func.getMutableBasicBlock(bbLabel);

  auto iter = bb.getMutableInsts().begin();
  for (;; ++iter) {
    auto &inst = *iter;
    if (ir::dyc<ir::Deleted>(inst))
      continue;
    const auto phi = ir::dyc<ir::Phi>(inst);
    if (!phi)
      break;

    if (!canProcessPhi(phi, valueNumber)) {
      valueNumber.set(phi->getDest(), phi->getDest());
      continue;
    }

    if (auto val = uniquePhiValues(phi)) { // phi is meaningless
      valueNumber.set(phi->getDest(), val);
      inst = std::make_shared<ir::Deleted>();
      ++cnt;
      continue;
    }

    auto key = instHash(inst);
    if (isIn(exprReg, key)) { // reusable
      valueNumber.set(phi->getDest(), exprReg.at(key));
      inst = std::make_shared<ir::Deleted>();
      ++cnt;
      continue;
    }

    valueNumber.set(phi->getDest(), phi->getDest());
    exprReg[key] = phi->getDest();
  }

  for (auto End = bb.getMutableInsts().end(); iter != End; ++iter) {
    auto &inst = *iter;
    auto newOperands = ir::getOperandsUsed(inst);
    for (auto &operand : newOperands)
      operand = valueNumber.get(operand);
    inst = ir::copyWithReplacedOperands(inst, newOperands);

    auto dest = ir::getDest(inst);
    if (!dest)
      continue;
    if (ir::dyc<ir::Load>(inst) || ir::dyc<ir::Alloca>(inst) ||
        ir::dyc<ir::Malloc>(inst) || ir::dyc<ir::Call>(inst)) {
      valueNumber.set(dest, dest);
      continue;
    }
    // Do not value number relation instructions.
    // [cf. instruction_selection.cpp, genRelation]
    if (ir::dyc<ir::RelationInst>(inst)) {
      valueNumber.set(dest, dest);
      continue;
    }

    auto key = instHash(inst);
    if (isIn(exprReg, key)) {
      auto res = exprReg.at(key);
      valueNumber.set(dest, res);
      inst = std::make_shared<ir::Deleted>();
      ++cnt;
      continue;
    }
    valueNumber.set(dest, dest);
    exprReg[key] = dest;
  }

  auto adjustPhi = [bbLabel,
                    &valueNumber](const std::shared_ptr<ir::Phi> &phi) {
    std::vector<ir::Phi::Option> newOptions;
    for (auto &option : phi->getOptions()) {
      if (option.second->getID() != bbLabel) {
        newOptions.emplace_back(option);
        continue;
      }
      newOptions.emplace_back(
          std::make_pair(valueNumber.get(option.first), option.second));
    }
    return std::make_shared<ir::Phi>(phi->getDest(), std::move(newOptions));
  };
  for (auto sucLabel : bb.getSuccessors()) {
    auto &sucBB = func.getMutableBasicBlock(sucLabel);
    for (auto &inst : sucBB.getMutableInsts()) {
      if (ir::dyc<ir::Deleted>(inst))
        continue;
      auto phi = ir::dyc<ir::Phi>(inst);
      if (!phi)
        break;
      inst = adjustPhi(phi);
    }
  }

  for (auto c : dominatorTree.getChildren(bbLabel))
    doValueNumbering(c, valueNumber, instHash, exprReg);
}